

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxout.cpp
# Opt level: O2

void __thiscall
ConfidentialTxOut_Constractor1_Test::TestBody(ConfidentialTxOut_Constractor1_Test *this)

{
  undefined8 uVar1;
  char *pcVar2;
  Amount AVar3;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_7;
  ConfidentialTxOutReference txout_ref;
  ConfidentialTxOut txout;
  
  cfd::core::ConfidentialTxOut::ConfidentialTxOut(&txout,&exp_script,&exp_asset,&exp_value);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&txout_ref,&txout.asset_);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
            ((string *)&gtest_ar_13,(ConfidentialAssetId *)&txout_ref);
  uVar1 = gtest_ar_13._0_8_;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&gtest_ar_3,&exp_asset);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txout.GetAsset().GetHex().c_str()","exp_asset.GetHex().c_str()",
             (char *)uVar1,(char *)gtest_ar_3._0_8_);
  std::__cxx11::string::~string((string *)&gtest_ar_3);
  std::__cxx11::string::~string((string *)&gtest_ar_13);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&txout_ref);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&txout_ref);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x44,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13,(Message *)&txout_ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txout_ref);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&txout_ref,&txout.confidential_value_);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_
            ((string *)&gtest_ar_13,(ConfidentialValue *)&txout_ref);
  uVar1 = gtest_ar_13._0_8_;
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_((string *)&gtest_ar_3,&exp_value);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txout.GetConfidentialValue().GetHex().c_str()",
             "exp_value.GetHex().c_str()",(char *)uVar1,(char *)gtest_ar_3._0_8_);
  std::__cxx11::string::~string((string *)&gtest_ar_3);
  std::__cxx11::string::~string((string *)&gtest_ar_13);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&txout_ref);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&txout_ref);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x46,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13,(Message *)&txout_ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txout_ref);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::AbstractTxOut::GetLockingScript((Script *)&txout_ref,&txout.super_AbstractTxOut);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&gtest_ar_13,(Script *)&txout_ref);
  uVar1 = gtest_ar_13._0_8_;
  cfd::core::Script::GetHex_abi_cxx11_((string *)&gtest_ar_3,&exp_script);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txout.GetLockingScript().GetHex().c_str()",
             "exp_script.GetHex().c_str()",(char *)uVar1,(char *)gtest_ar_3._0_8_);
  std::__cxx11::string::~string((string *)&gtest_ar_3);
  std::__cxx11::string::~string((string *)&gtest_ar_13);
  cfd::core::Script::~Script((Script *)&txout_ref);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&txout_ref);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x48,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13,(Message *)&txout_ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txout_ref);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)&txout_ref,&txout.nonce_);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_
            ((string *)&gtest_ar_13,(ConfidentialNonce *)&txout_ref);
  pcVar2 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_3,"txout.GetNonce().GetHex().c_str()","\"\"",
             (char *)gtest_ar_13._0_8_,"");
  std::__cxx11::string::~string((string *)&gtest_ar_13);
  cfd::core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)&txout_ref);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&txout_ref);
    if ((undefined8 *)CONCAT71(gtest_ar_3.message_.ptr_._1_7_,gtest_ar_3.message_.ptr_._0_1_) !=
        (undefined8 *)0x0) {
      pcVar2 = *(char **)CONCAT71(gtest_ar_3.message_.ptr_._1_7_,gtest_ar_3.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x49,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13,(Message *)&txout_ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txout_ref);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_13,
             &txout.range_proof_.data_);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&txout_ref,(ByteData *)&gtest_ar_13);
  pcVar2 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_3,"txout.GetRangeProof().GetHex().c_str()","\"\"",
             (char *)CONCAT71(txout_ref.super_AbstractTxOutReference._vptr_AbstractTxOutReference.
                              _1_7_,(char)txout_ref.super_AbstractTxOutReference.
                                          _vptr_AbstractTxOutReference),"");
  std::__cxx11::string::~string((string *)&txout_ref);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_13);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&txout_ref);
    if ((undefined8 *)CONCAT71(gtest_ar_3.message_.ptr_._1_7_,gtest_ar_3.message_.ptr_._0_1_) !=
        (undefined8 *)0x0) {
      pcVar2 = *(char **)CONCAT71(gtest_ar_3.message_.ptr_._1_7_,gtest_ar_3.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x4a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13,(Message *)&txout_ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txout_ref);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_13,
             &txout.surjection_proof_.data_);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&txout_ref,(ByteData *)&gtest_ar_13);
  pcVar2 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_3,"txout.GetSurjectionProof().GetHex().c_str()","\"\"",
             (char *)CONCAT71(txout_ref.super_AbstractTxOutReference._vptr_AbstractTxOutReference.
                              _1_7_,(char)txout_ref.super_AbstractTxOutReference.
                                          _vptr_AbstractTxOutReference),"");
  std::__cxx11::string::~string((string *)&txout_ref);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_13);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&txout_ref);
    if ((undefined8 *)CONCAT71(gtest_ar_3.message_.ptr_._1_7_,gtest_ar_3.message_.ptr_._0_1_) !=
        (undefined8 *)0x0) {
      pcVar2 = *(char **)CONCAT71(gtest_ar_3.message_.ptr_._1_7_,gtest_ar_3.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x4b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13,(Message *)&txout_ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txout_ref);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  AVar3 = cfd::core::AbstractTxOut::GetValue(&txout.super_AbstractTxOut);
  gtest_ar_13._0_8_ = AVar3.amount_;
  gtest_ar_13.message_.ptr_._0_1_ = AVar3.ignore_check_;
  gtest_ar_3._0_8_ = cfd::core::Amount::GetSatoshiValue((Amount *)&gtest_ar_13);
  gtest_ar._0_8_ = (ulong)(uint)gtest_ar._4_4_ << 0x20;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&txout_ref,"txout.GetValue().GetSatoshiValue()","0",(long *)&gtest_ar_3,
             (int *)&gtest_ar);
  if ((char)txout_ref.super_AbstractTxOutReference._vptr_AbstractTxOutReference == '\0') {
    testing::Message::Message((Message *)&gtest_ar_13);
    if (txout_ref.super_AbstractTxOutReference.value_.amount_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)txout_ref.super_AbstractTxOutReference.value_.amount_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x4c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&gtest_ar_13);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_13);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&txout_ref.super_AbstractTxOutReference.value_);
  cfd::core::ConfidentialTxOutReference::ConfidentialTxOutReference(&txout_ref,&txout);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&gtest_ar_13,&txout_ref.asset_);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
            ((string *)&gtest_ar_3,(ConfidentialAssetId *)&gtest_ar_13);
  uVar1 = gtest_ar_3._0_8_;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&gtest_ar,&exp_asset);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_7,"txout_ref.GetAsset().GetHex().c_str()",
             "exp_asset.GetHex().c_str()",(char *)uVar1,(char *)gtest_ar._0_8_);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar_3);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&gtest_ar_13);
  if (gtest_ar_7.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_13);
    if (gtest_ar_7.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_7.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x50,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&gtest_ar_13);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_13);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_7.message_);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&gtest_ar_13,&txout_ref.confidential_value_);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_
            ((string *)&gtest_ar_3,(ConfidentialValue *)&gtest_ar_13);
  uVar1 = gtest_ar_3._0_8_;
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_((string *)&gtest_ar,&exp_value);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_7,"txout_ref.GetConfidentialValue().GetHex().c_str()",
             "exp_value.GetHex().c_str()",(char *)uVar1,(char *)gtest_ar._0_8_);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar_3);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&gtest_ar_13);
  if (gtest_ar_7.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_13);
    if (gtest_ar_7.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_7.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x52,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&gtest_ar_13);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_13);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_7.message_);
  cfd::core::Script::Script
            ((Script *)&gtest_ar_13,&txout_ref.super_AbstractTxOutReference.locking_script_);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&gtest_ar_3,(Script *)&gtest_ar_13);
  uVar1 = gtest_ar_3._0_8_;
  cfd::core::Script::GetHex_abi_cxx11_((string *)&gtest_ar,&exp_script);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_7,"txout_ref.GetLockingScript().GetHex().c_str()",
             "exp_script.GetHex().c_str()",(char *)uVar1,(char *)gtest_ar._0_8_);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar_3);
  cfd::core::Script::~Script((Script *)&gtest_ar_13);
  if (gtest_ar_7.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_13);
    if (gtest_ar_7.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_7.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x54,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&gtest_ar_13);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_13);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_7.message_);
  cfd::core::ConfidentialNonce::ConfidentialNonce
            ((ConfidentialNonce *)&gtest_ar_13,&txout_ref.nonce_);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_
            ((string *)&gtest_ar_3,(ConfidentialNonce *)&gtest_ar_13);
  pcVar2 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txout_ref.GetNonce().GetHex().c_str()","\"\"",
             (char *)gtest_ar_3._0_8_,"");
  std::__cxx11::string::~string((string *)&gtest_ar_3);
  cfd::core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)&gtest_ar_13);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_13);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&gtest_ar_13);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_13);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_3,
             &txout_ref.range_proof_.data_);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar_13,(ByteData *)&gtest_ar_3);
  pcVar2 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txout_ref.GetRangeProof().GetHex().c_str()","\"\"",
             (char *)gtest_ar_13._0_8_,"");
  std::__cxx11::string::~string((string *)&gtest_ar_13);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_3);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_13);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x56,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&gtest_ar_13);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_13);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_3,
             &txout_ref.surjection_proof_.data_);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar_13,(ByteData *)&gtest_ar_3);
  pcVar2 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txout_ref.GetSurjectionProof().GetHex().c_str()","\"\"",
             (char *)gtest_ar_13._0_8_,"");
  std::__cxx11::string::~string((string *)&gtest_ar_13);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_3);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_13);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x57,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&gtest_ar_13);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_13);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_3._0_8_ = txout_ref.super_AbstractTxOutReference.value_.amount_;
  gtest_ar_3.message_.ptr_._0_1_ = txout_ref.super_AbstractTxOutReference.value_.ignore_check_;
  gtest_ar._0_8_ = cfd::core::Amount::GetSatoshiValue((Amount *)&gtest_ar_3);
  gtest_ar_7.success_ = false;
  gtest_ar_7._1_3_ = 0;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar_13,"txout_ref.GetValue().GetSatoshiValue()","0",(long *)&gtest_ar
             ,(int *)&gtest_ar_7);
  if (gtest_ar_13.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_3);
    if ((undefined8 *)CONCAT71(gtest_ar_13.message_.ptr_._1_7_,gtest_ar_13.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)CONCAT71(gtest_ar_13.message_.ptr_._1_7_,gtest_ar_13.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x58,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_13.message_);
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&txout_ref);
  cfd::core::ConfidentialTxOut::~ConfidentialTxOut(&txout);
  return;
}

Assistant:

TEST(ConfidentialTxOut, Constractor1) {
  // Script, ConfidentialAssetId, ConfidentialValue
  ConfidentialTxOut txout(exp_script, exp_asset, exp_value);
  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), exp_asset.GetHex().c_str());
  EXPECT_STREQ(txout.GetConfidentialValue().GetHex().c_str(),
               exp_value.GetHex().c_str());
  EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(),
               exp_script.GetHex().c_str());
  EXPECT_STREQ(txout.GetNonce().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetRangeProof().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetSurjectionProof().GetHex().c_str(), "");
  EXPECT_EQ(txout.GetValue().GetSatoshiValue(), 0);

  ConfidentialTxOutReference txout_ref(txout);
  EXPECT_STREQ(txout_ref.GetAsset().GetHex().c_str(),
               exp_asset.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetConfidentialValue().GetHex().c_str(),
               exp_value.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetLockingScript().GetHex().c_str(),
               exp_script.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetNonce().GetHex().c_str(), "");
  EXPECT_STREQ(txout_ref.GetRangeProof().GetHex().c_str(), "");
  EXPECT_STREQ(txout_ref.GetSurjectionProof().GetHex().c_str(), "");
  EXPECT_EQ(txout_ref.GetValue().GetSatoshiValue(), 0);
}